

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O2

void __thiscall pg::FPISolver::run_par(FPISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head)

{
  int iVar1;
  int i;
  Game *pGVar2;
  int *piVar3;
  uint64_t *puVar4;
  int p;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  ostream *poVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t uVar15;
  long lVar16;
  long lVar17;
  
  pGVar2 = (this->super_Solver).game;
  lVar16 = pGVar2->n_vertices;
  piVar3 = pGVar2->_priority;
  iVar1 = *(int *)((long)piVar3 + ((lVar16 << 0x20) + -0x100000000 >> 0x1e));
  lVar17 = (long)iVar1;
  uVar8 = 0xffffffffffffffff;
  if (-2 < lVar17) {
    uVar8 = lVar17 * 4 + 4;
  }
  pvVar6 = operator_new__(uVar8);
  pvVar7 = operator_new__(uVar8);
  iVar10 = 0;
  for (uVar8 = 0; (long)uVar8 <= lVar17; uVar8 = uVar8 + 1) {
    lVar12 = (long)iVar10;
    if (uVar8 == (uint)piVar3[lVar12]) {
      *(int *)((long)pvVar6 + uVar8 * 4) = iVar10;
      lVar11 = 0;
      puVar4 = (this->parity)._bits;
      while ((uVar14 = lVar12 + lVar11, (long)uVar14 < lVar16 &&
             (uVar8 == (uint)piVar3[lVar12 + lVar11]))) {
        uVar13 = uVar14 >> 6;
        uVar14 = 1L << (uVar14 & 0x3f);
        if ((uVar8 & 1) == 0) {
          uVar15 = ~uVar14 & puVar4[uVar13];
        }
        else {
          uVar15 = uVar14 | puVar4[uVar13];
        }
        puVar4[uVar13] = uVar15;
        lVar11 = lVar11 + 1;
        lVar16 = pGVar2->n_vertices;
      }
      iVar10 = iVar10 + (int)lVar11;
    }
    else {
      *(undefined4 *)((long)pvVar6 + uVar8 * 4) = 0xffffffff;
      lVar11 = 0;
    }
    *(int *)((long)pvVar7 + uVar8 * 4) = (int)lVar11;
  }
  iVar10 = 0;
  this->iterations = 1;
LAB_0014e7b0:
  do {
    if (iVar1 < iVar10) {
      operator_delete__(pvVar6);
      operator_delete__(pvVar7);
      return;
    }
    iVar5 = *(int *)((long)pvVar7 + (long)iVar10 * 4);
    if (iVar5 != 0) {
      i = *(int *)((long)pvVar6 + (long)iVar10 * 4);
      iVar5 = update_block_rec(this,__lace_worker,__lace_dq_head,i,iVar5);
      if (iVar5 != 0) {
        if (iVar10 != 0) {
          freeze_thaw_reset_rec_CALL(__lace_worker,__lace_dq_head,this,0,i,iVar10);
        }
        this->iterations = this->iterations + 1;
        iVar10 = 0;
        if (1 < (this->super_Solver).trace) {
          poVar9 = std::operator<<((this->super_Solver).logger,
                                   "restarting after finding distractions");
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        goto LAB_0014e7b0;
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void
FPISolver::run_par(WorkerP* __lace_worker, Task* __lace_dq_head)
{
    int d = this->priority(this->nodecount()-1);
    int *p_start = new int[d+1];
    int *p_len = new int[d+1];

    // initialize p_start, p_len, parity
    {
        int v=0;
        for (int p=0; p<=d; p++) {
            if (this->priority(v) == p) {
                p_start[p] = v;
                while (v < this->nodecount() and this->priority(v) == p) {
                    this->parity[v] = p&1;
                    v++;
                }
                p_len[p] = v - p_start[p];
            } else {
                p_start[p] = -1;
                p_len[p] = 0;
            }
        }
    }

    this->iterations = 1;
    int p = 0;
    while (p <= d) {
        if (p_len[p] == 0) {
            p++;
        } else if (CALL(update_block_rec, this, p_start[p], p_len[p])) {
            // something changed, freeze and reset
            if (p != 0) {
                CALL(freeze_thaw_reset_rec, this, 0, p_start[p], p);
                p = 0;
            }
            this->iterations++;
#ifndef NDEBUG
            if (this->trace >= 2) this->logger << "restarting after finding distractions" << std::endl;
#endif
        } else {
            // nothing changed
            p++;
        }
    }

    delete[] p_start;
    delete[] p_len;
}